

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O0

strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
* __thiscall
ezy::features::result_interface<ezy::features::optional_adapter>::
impl<ezy::strong_type<std::optional<int>,void,ezy::features::result_interface<ezy::features::optional_adapter>>>
::
map_error<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>,____C_A_T_C_H____T_E_S_T____28()::__11_const&>
          (strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
           *__return_storage_ptr__,
          impl<ezy::strong_type<std::optional<int>,void,ezy::features::result_interface<ezy::features::optional_adapter>>>
          *this,anon_class_1_0_00000001 *fn_err)

{
  anon_class_1_0_00000001 *in_RCX;
  anon_class_1_0_00000001 *fn_err_local;
  impl<ezy::strong_type<std::optional<int>,_void,_ezy::features::result_interface<ezy::features::optional_adapter>_>_>
  *this_local;
  
  _impl::
  map_error<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>,ezy::strong_type<std::optional<int>,void,ezy::features::result_interface<ezy::features::optional_adapter>>const&,____C_A_T_C_H____T_E_S_T____28()::__11_const&>
            (__return_storage_ptr__,(_impl *)this,
             (strong_type<std::optional<int>,_void,_ezy::features::result_interface<ezy::features::optional_adapter>_>
              *)fn_err,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

constexpr decltype(auto) map_error(FnErr&& fn_err) const &
      {
        return _impl::template map_error<Ret>(static_cast<const T&>(*this), std::forward<FnErr>(fn_err));
      }